

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O3

int16_t __thiscall BoxNesting::HopcroftKarpAlgorithm::runAlgorithm(HopcroftKarpAlgorithm *this)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  short sVar4;
  int16_t iVar5;
  short vertex;
  value_type_conflict4 local_3c;
  allocator_type local_39;
  vector<short,_std::allocator<short>_> local_38;
  
  std::vector<short,_std::allocator<short>_>::vector
            (&local_38,(long)this->leftVerticesCount + 1,&NILL,(allocator_type *)&local_3c);
  psVar1 = (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((psVar1 != (pointer)0x0) &&
     (operator_delete(psVar1,(long)psVar2 - (long)psVar1),
     local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<short,_std::allocator<short>_>::vector
            (&local_38,(long)this->rightVerticesCount + 1,&NILL,(allocator_type *)&local_3c);
  psVar1 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((psVar1 != (pointer)0x0) &&
     (operator_delete(psVar1,(long)psVar2 - (long)psVar1),
     local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_3c = 0;
  std::vector<short,_std::allocator<short>_>::vector
            (&local_38,(long)this->leftVerticesCount + 1,&local_3c,&local_39);
  psVar1 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((psVar1 != (pointer)0x0) &&
     (operator_delete(psVar1,(long)psVar2 - (long)psVar1),
     local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar5 = this->leftVerticesCount;
  while (bVar3 = bfs(this), bVar3) {
    sVar4 = this->leftVerticesCount;
    if (0 < sVar4) {
      vertex = 1;
      do {
        if ((this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[vertex] == 0) {
          bVar3 = dfs(this,vertex);
          iVar5 = iVar5 - (ushort)bVar3;
          sVar4 = this->leftVerticesCount;
        }
        vertex = vertex + 1;
      } while (vertex <= sVar4);
    }
  }
  return iVar5;
}

Assistant:

int16_t HopcroftKarpAlgorithm::runAlgorithm() const
{
	this->pairsLeft = std::vector<int16_t>(this->leftVerticesCount + 1, NILL);
	this->pairsRight = std::vector<int16_t>(this->rightVerticesCount + 1, NILL);
	this->distances = std::vector<int16_t>(this->leftVerticesCount + 1, 0);

	// We have the same amount of visible boxes as there
	// are vertices in the left partition
	// for each valid match (i.e. a box can nest inside another box)
	// we remove a visible box
	int16_t visibleBoxes = this->leftVerticesCount;

	while (bfs()) 
	{ 
		// Find a free vertex 
		for (int16_t i = 1; i <= leftVerticesCount; ++i)
		{
			if (pairsLeft[i] == NILL && this->dfs(i))
			{
				--visibleBoxes;
			}
		}
	}

	return visibleBoxes;
}